

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O1

void __thiscall AMColorset::initFromColors(AMColorset *this,uchar *colors,bool showlocks)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  byte *pbVar5;
  
  pbVar5 = colors + 2;
  lVar4 = 0;
  do {
    bVar3 = pbVar5[-2];
    if (((bVar3 == 1) && (pbVar5[-1] == 0)) && (*pbVar5 == 0)) {
      this->c[lVar4].Index = -1;
      this->c[lVar4].RGB = 0xffffffff;
    }
    else {
      bVar1 = pbVar5[-1];
      bVar2 = *pbVar5;
      this->c[lVar4].RGB = ((uint)bVar2 + ((uint)bVar1 << 8 | (uint)bVar3 << 0x10)) - 0x1000000;
      bVar3 = FColorMatcher::Pick(&ColorMatcher,(uint)bVar3,(uint)bVar1,(uint)bVar2);
      this->c[lVar4].Index = (uint)bVar3;
    }
    lVar4 = lVar4 + 1;
    pbVar5 = pbVar5 + 3;
  } while (lVar4 != 0x18);
  this->displayLocks = showlocks;
  this->forcebackground = false;
  return;
}

Assistant:

void initFromColors(const unsigned char *colors, bool showlocks)
	{
		for(int i=0, j=0; i<AM_NUM_COLORS; i++, j+=3)
		{
			if (colors[j] == 1 && colors[j+1] == 0 && colors[j+2] == 0)
			{
				c[i].setInvalid();
			}
			else
			{
				c[i].FromRGB(colors[j], colors[j+1], colors[j+2]);
			}
		}
		displayLocks = showlocks;
		forcebackground = false;
	}